

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiWindow *window_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ImGuiPopupData *pIVar6;
  ImGuiWindow **ppIVar7;
  ImDrawList *text_begin;
  char *pcVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  char *in_stack_000000a0;
  ImDrawList *in_stack_000000a8;
  ImGuiWindow *in_stack_000000b0;
  float font_size;
  char buf_1 [32];
  ImRect r_1;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_2;
  char *input_source_names [5];
  char *buf;
  ImGuiWindowSettings *settings;
  int n_1;
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  ImRect r;
  int rect_n;
  ImGuiIO *io;
  ImGuiContext *g;
  char *trt_rects_names [11];
  char *wrt_rects_names [7];
  ImVec2 *in_stack_fffffffffffffd98;
  ImPool<ImGuiTabBar> *in_stack_fffffffffffffda0;
  ImDrawList *in_stack_fffffffffffffda8;
  ImGuiWindow *in_stack_fffffffffffffdb0;
  ImVec2 *in_stack_fffffffffffffdb8;
  ImDrawList *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  ImGuiWindowSettings *in_stack_fffffffffffffdd0;
  ImChunkStream<ImGuiWindowSettings> *in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  char *local_208;
  float in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  ImVec2 *in_stack_fffffffffffffe38;
  ImDrawList *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int iVar12;
  char *in_stack_fffffffffffffec8;
  ImGuiTabBar *in_stack_fffffffffffffef0;
  ImVec2 local_108;
  char *local_100;
  ImGuiWindowSettings *local_f8;
  int local_f0;
  int local_ec;
  ImGuiWindow *local_e8;
  int local_dc;
  int local_d8;
  ImRect local_d4;
  int local_c4;
  ImVec2 local_c0;
  ImGuiIO *local_b8;
  ImGuiContext *local_b0;
  undefined1 local_a8 [96];
  undefined8 local_48 [9];
  
  bVar1 = Begin((char *)window_1,(bool *)draw_list,(ImGuiWindowFlags)r_1.Max.y);
  if (bVar1) {
    memcpy(local_48,&PTR_anon_var_dwarf_8625e_00271bb0,0x38);
    memcpy(local_a8,&PTR_anon_var_dwarf_8625e_00271bf0,0x58);
    local_b0 = GImGui;
    local_b8 = GetIO();
    pcVar5 = GetVersion();
    Text("Dear ImGui %s",pcVar5);
    Text((char *)(double)(1000.0 / local_b8->Framerate),
         "Application average %.3f ms/frame (%.1f FPS)");
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)local_b8->MetricsRenderVertices,
         (ulong)(uint)local_b8->MetricsRenderIndices,
         (long)local_b8->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)local_b8->MetricsActiveWindows,
         (ulong)(uint)local_b8->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)local_b8->MetricsActiveAllocations);
    Separator();
    bVar1 = TreeNode((char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      ImVec2::ImVec2(&local_c0,0.0,0.0);
      bVar1 = Button((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if (bVar1) {
        DebugStartItemPicker();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),SUB84(in_stack_fffffffffffffda0,0))
      ;
      MetricsHelpMarker((char *)0x1cfae3);
      Checkbox(in_stack_fffffffffffffec8,
               (bool *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      Checkbox(in_stack_fffffffffffffec8,
               (bool *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      SameLine((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),SUB84(in_stack_fffffffffffffda0,0))
      ;
      fVar10 = GetFontSize();
      SetNextItemWidth(fVar10 * 12.0);
      bVar2 = Combo((char *)in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8,
                    (char **)in_stack_fffffffffffffda0,
                    (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98);
      bVar1 = (ShowMetricsWindow::show_windows_rects & 1U) != 0;
      ShowMetricsWindow::show_windows_rects = bVar1 || bVar2;
      if ((bVar1 || bVar2) && (local_b0->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",local_b0->NavWindow->Name);
        Indent((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
        for (local_c4 = 0; local_c4 < 7; local_c4 = local_c4 + 1) {
          local_d4 = ShowMetricsWindow::Funcs::GetWindowRect
                               (in_stack_fffffffffffffdb0,
                                (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
          pcVar5 = (char *)(double)local_d4.Min.x;
          in_stack_fffffffffffffe38 = (ImVec2 *)(double)local_d4.Min.y;
          in_stack_fffffffffffffe40 = (ImDrawList *)(double)local_d4.Max.x;
          dVar11 = (double)local_d4.Max.y;
          fVar10 = ImRect::GetWidth(&local_d4);
          fVar9 = ImRect::GetHeight(&local_d4);
          Text(pcVar5,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,dVar11,(double)fVar10,
               (double)fVar9,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",local_48[local_c4])
          ;
        }
        Unindent((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      }
      Checkbox(in_stack_fffffffffffffec8,
               (bool *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      Checkbox(in_stack_fffffffffffffec8,
               (bool *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      TreePop();
    }
    ShowMetricsWindow::Funcs::NodeWindows
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffda0,
               (char *)in_stack_fffffffffffffd98);
    bVar1 = TreeNode("DrawLists","Active DrawLists (%d)",
                     (ulong)(uint)(local_b0->DrawDataBuilder).Layers[0].Size);
    if (bVar1) {
      for (local_d8 = 0; local_d8 < (local_b0->DrawDataBuilder).Layers[0].Size;
          local_d8 = local_d8 + 1) {
        ImVector<ImDrawList_*>::operator[]
                  ((ImVector<ImDrawList_*> *)in_stack_fffffffffffffda0,
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        ShowMetricsWindow::Funcs::NodeDrawList
                  (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      }
      TreePop();
    }
    bVar1 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(local_b0->OpenPopupStack).Size);
    if (bVar1) {
      for (local_dc = 0; local_dc < (local_b0->OpenPopupStack).Size; local_dc = local_dc + 1) {
        pIVar6 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)in_stack_fffffffffffffda0,
                            (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_e8 = pIVar6->Window;
        pIVar6 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)in_stack_fffffffffffffda0,
                            (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        in_stack_fffffffffffffe34 = pIVar6->PopupId;
        if (local_e8 == (ImGuiWindow *)0x0) {
          in_stack_fffffffffffffe28 = "NULL";
        }
        else {
          in_stack_fffffffffffffe28 = local_e8->Name;
        }
        uVar3 = in_stack_fffffffffffffe24 & 0xffffff;
        if (local_e8 != (ImGuiWindow *)0x0) {
          uVar3 = CONCAT13((local_e8->Flags & 0x1000000U) != 0,(int3)in_stack_fffffffffffffe24);
        }
        in_stack_fffffffffffffe24 = uVar3;
        pcVar5 = "";
        if ((char)(in_stack_fffffffffffffe24 >> 0x18) != '\0') {
          pcVar5 = " ChildWindow";
        }
        bVar1 = false;
        if (local_e8 != (ImGuiWindow *)0x0) {
          bVar1 = (local_e8->Flags & 0x10000000U) != 0;
        }
        pcVar8 = "";
        if (bVar1) {
          pcVar8 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)in_stack_fffffffffffffe34,
                   in_stack_fffffffffffffe28,pcVar5,pcVar8);
      }
      TreePop();
    }
    uVar3 = ImPool<ImGuiTabBar>::GetSize(&local_b0->TabBars);
    bVar1 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar3);
    if (bVar1) {
      for (local_ec = 0; iVar12 = local_ec, iVar4 = ImPool<ImGuiTabBar>::GetSize(&local_b0->TabBars)
          , iVar12 < iVar4; local_ec = local_ec + 1) {
        ImPool<ImGuiTabBar>::GetByIndex
                  (in_stack_fffffffffffffda0,(ImPoolIdx)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        ShowMetricsWindow::Funcs::NodeTabBar(in_stack_fffffffffffffef0);
      }
      TreePop();
    }
    bVar1 = TreeNode((char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      bVar1 = SmallButton((char *)in_stack_fffffffffffffdb0);
      if (bVar1) {
        ClearIniSettings();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),SUB84(in_stack_fffffffffffffda0,0))
      ;
      bVar1 = SmallButton((char *)in_stack_fffffffffffffdb0);
      if (bVar1) {
        SaveIniSettingsToDisk((char *)in_stack_fffffffffffffdb0);
      }
      SameLine((float)((ulong)in_stack_fffffffffffffda0 >> 0x20),SUB84(in_stack_fffffffffffffda0,0))
      ;
      if ((local_b0->IO).IniFilename == (char *)0x0) {
        TextUnformatted((char *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
      }
      else {
        Text("\"%s\"",(local_b0->IO).IniFilename);
      }
      Text((char *)(double)local_b0->SettingsDirtyTimer,"SettingsDirtyTimer %.2f");
      bVar1 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(local_b0->SettingsHandlers).Size);
      if (bVar1) {
        for (local_f0 = 0; local_f0 < (local_b0->SettingsHandlers).Size; local_f0 = local_f0 + 1) {
          ImVector<ImGuiSettingsHandler>::operator[]
                    ((ImVector<ImGuiSettingsHandler> *)in_stack_fffffffffffffda0,
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
          TextUnformatted((char *)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
        }
        TreePop();
      }
      uVar3 = ImChunkStream<ImGuiWindowSettings>::size(&local_b0->SettingsWindows);
      bVar1 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar3);
      if (bVar1) {
        local_f8 = ImChunkStream<ImGuiWindowSettings>::begin(&local_b0->SettingsWindows);
        while (local_f8 != (ImGuiWindowSettings *)0x0) {
          ShowMetricsWindow::Funcs::NodeWindowSettings
                    ((ImGuiWindowSettings *)in_stack_fffffffffffffdb0);
          local_f8 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                               (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        }
        TreePop();
      }
      uVar3 = ImGuiTextBuffer::size(&local_b0->SettingsIniData);
      bVar1 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar3);
      if (bVar1) {
        if ((local_b0->SettingsIniData).Buf.Data == (char *)0x0) {
          local_208 = "";
        }
        else {
          local_208 = (local_b0->SettingsIniData).Buf.Data;
        }
        local_100 = local_208;
        ImVec2::ImVec2(&local_108,-1.1754944e-38,0.0);
        in_stack_fffffffffffffd98 = (ImVec2 *)0x0;
        InputTextMultiline((char *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           (size_t)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                           (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                           (ImGuiInputTextCallback)in_stack_fffffffffffffda8,
                           in_stack_fffffffffffffde0);
        TreePop();
      }
      TreePop();
    }
    bVar1 = TreeNode((char *)in_stack_fffffffffffffd98);
    if (bVar1) {
      memcpy(&stack0xfffffffffffffec8,&DAT_00271c50,0x28);
      if (local_b0->HoveredWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_b0->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar5);
      if (local_b0->HoveredRootWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_b0->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar5);
      Text((char *)(double)local_b0->HoveredIdTimer,
           "HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(ulong)local_b0->HoveredId,
           (ulong)local_b0->HoveredIdPreviousFrame,(ulong)(local_b0->HoveredIdAllowOverlap & 1));
      Text((char *)(double)local_b0->ActiveIdTimer,
           "ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (ulong)local_b0->ActiveId,(ulong)local_b0->ActiveIdPreviousFrame,
           (ulong)(local_b0->ActiveIdAllowOverlap & 1),
           *(undefined8 *)(&stack0xfffffffffffffec8 + (ulong)local_b0->ActiveIdSource * 8));
      if (local_b0->ActiveIdWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_b0->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar5);
      if (local_b0->MovingWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_b0->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar5);
      if (local_b0->NavWindow == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffdc0 = (ImDrawList *)0x23989d;
      }
      else {
        in_stack_fffffffffffffdc0 = (ImDrawList *)local_b0->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",in_stack_fffffffffffffdc0);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)local_b0->NavId,(ulong)local_b0->NavLayer);
      Text("NavInputSource: %s",
           *(undefined8 *)(&stack0xfffffffffffffec8 + (ulong)local_b0->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)((local_b0->IO).NavActive & 1),
           (ulong)((local_b0->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)local_b0->NavActivateId,
           (ulong)local_b0->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(local_b0->NavDisableHighlight & 1),(ulong)(local_b0->NavDisableMouseHover & 1));
      if (local_b0->NavWindowingTarget == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffdb8 = (ImVec2 *)0x23989d;
      }
      else {
        in_stack_fffffffffffffdb8 = (ImVec2 *)local_b0->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",in_stack_fffffffffffffdb8);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(local_b0->DragDropActive & 1),(ulong)(local_b0->DragDropPayload).SourceId,
           (local_b0->DragDropPayload).DataType,(ulong)(uint)(local_b0->DragDropPayload).DataSize);
      TreePop();
    }
    if (((ShowMetricsWindow::show_windows_rects & 1U) != 0) ||
       ((ShowMetricsWindow::show_windows_begin_order & 1U) != 0)) {
      for (iVar12 = 0; iVar12 < (local_b0->Windows).Size; iVar12 = iVar12 + 1) {
        ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                            ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffda0,
                             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        window_00 = *ppIVar7;
        if ((window_00->WasActive & 1U) != 0) {
          text_begin = GetForegroundDrawList(window_00);
          if ((ShowMetricsWindow::show_windows_rects & 1U) != 0) {
            ShowMetricsWindow::Funcs::GetWindowRect
                      (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
            ImDrawList::AddRect(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                (ImU32)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                                SUB84(in_stack_fffffffffffffe28,0),in_stack_fffffffffffffe24,
                                in_stack_fffffffffffffe20);
          }
          if (((ShowMetricsWindow::show_windows_begin_order & 1U) != 0) &&
             ((window_00->Flags & 0x1000000U) == 0)) {
            ImFormatString(&stack0xfffffffffffffe78,0x20,"%d",
                           (ulong)(uint)(int)window_00->BeginOrderWithinContext);
            fVar10 = GetFontSize();
            in_stack_fffffffffffffdb0 = (ImGuiWindow *)&window_00->Pos;
            in_stack_fffffffffffffda0 = (ImPool<ImGuiTabBar> *)&stack0xfffffffffffffe64;
            ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffda0,fVar10,fVar10);
            operator+(in_stack_fffffffffffffd98,(ImVec2 *)0x1d086a);
            ImDrawList::AddRectFilled
                      (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                       (ImVec2 *)in_stack_fffffffffffffdb0,(ImU32)((ulong)text_begin >> 0x20),
                       SUB84(text_begin,0),
                       (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffda0 >> 0x20));
            ImDrawList::AddText(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                (ImU32)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(char *)text_begin
                                ,(char *)in_stack_fffffffffffffda0);
            in_stack_fffffffffffffda8 = text_begin;
          }
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };

    // State
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_tables_rects = false;
    static int  show_tables_rect_type = TRT_WorkRect;
    static bool show_drawcmd_mesh = true;
    static bool show_drawcmd_aabb = true;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList()
    // - NodeColumns()
    // - NodeWindow()
    // - NodeWindows()
    // - NodeTabBar()
    // - NodeStorage()
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }

        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (!window->WasActive)
                ImGui::TextDisabled("Note: window is not currently visible.");
            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }

        static void NodeWindowSettings(ImGuiWindowSettings* settings)
        {
            ImGui::Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
                settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            p += ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s'", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "");
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }

        static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }
    };

    // Tools
    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();
        ImGui::SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show mesh when hovering ImDrawCmd", &show_drawcmd_mesh);
        ImGui::Checkbox("Show bounding boxes when hovering ImDrawCmd", &show_drawcmd_aabb);
        ImGui::TreePop();
    }

    // Contents
    Funcs::NodeWindows(g.Windows, "Windows");
    //Funcs::NodeWindows(g.WindowsFocusOrder, "WindowsFocusOrder");
    if (ImGui::TreeNode("DrawLists", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    // Details for Popups
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    // Details for TabBars
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
    IM_UNUSED(show_tables_rects);
    IM_UNUSED(show_tables_rect_type);
#ifdef IMGUI_HAS_TABLE
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            Funcs::NodeTable(g.Tables.GetByIndex(n));
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (ImGui::TreeNode("Docking"))
    {
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (ImGui::TreeNode("Settings"))
    {
        if (ImGui::SmallButton("Clear"))
            ImGui::ClearIniSettings();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to disk"))
            ImGui::SaveIniSettingsToDisk(g.IO.IniFilename);
        ImGui::SameLine();
        if (g.IO.IniFilename)
            ImGui::Text("\"%s\"", g.IO.IniFilename);
        else
            ImGui::TextUnformatted("<NULL>");
        ImGui::Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (ImGui::TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                ImGui::TextUnformatted(g.SettingsHandlers[n].TypeName);
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                Funcs::NodeWindowSettings(settings);
            ImGui::TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (ImGui::TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                Funcs::NodeTableSettings(settings);
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (ImGui::TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            char* buf = (char*)(void*)(g.SettingsIniData.Buf.Data ? g.SettingsIniData.Buf.Data : "");
            ImGui::InputTextMultiline("##Ini", buf, g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, 0.0f), ImGuiInputTextFlags_ReadOnly);
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }

    // Misc Details
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    ImGui::End();
}